

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

timespec timespec_add(timespec ts1,timespec ts2)

{
  timespec ts;
  timespec ts_00;
  __syscall_slong_t in_RCX;
  __time_t in_RDX;
  __syscall_slong_t in_RSI;
  __time_t in_RDI;
  timespec tVar1;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ts.tv_nsec = in_RSI;
  ts.tv_sec = in_RDI;
  tVar1 = timespec_normalise(ts);
  local_48 = tVar1.tv_sec;
  uStack_40 = tVar1.tv_nsec;
  tVar1.tv_nsec = in_RCX;
  tVar1.tv_sec = in_RDX;
  tVar1 = timespec_normalise(tVar1);
  local_58 = tVar1.tv_sec;
  uStack_50 = tVar1.tv_nsec;
  ts_00.tv_nsec = uStack_40 + uStack_50;
  ts_00.tv_sec = local_48 + local_58;
  tVar1 = timespec_normalise(ts_00);
  return tVar1;
}

Assistant:

static struct timespec timespec_add(struct timespec ts1, struct timespec ts2)
{
	/*
	 * Normalize inputs to prevent tv_nsec rollover if
	 * whole-second values are packed in it.
	 */
	ts1 = timespec_normalise(ts1);
	ts2 = timespec_normalise(ts2);

	ts1.tv_sec += ts2.tv_sec;
	ts1.tv_nsec += ts2.tv_nsec;

	return timespec_normalise(ts1);
}